

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void glu::sl::dumpValues(TestLog *log,
                        vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values,
                        char *storageName,int arrayNdx)

{
  pointer pEVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *__s;
  DataType DVar6;
  ulong uVar7;
  ostringstream *this;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int elemNdx;
  ostringstream result;
  undefined1 auStack_3a8 [12];
  uint local_39c;
  ulong local_398;
  float local_38c;
  ulong local_388;
  int local_37c;
  pointer local_378;
  uint local_36c;
  char *local_368;
  long *local_360;
  long local_358;
  long local_350 [2];
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *local_340;
  TestLog *local_338;
  ulong local_330;
  long local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_378 = (values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
              super__Vector_impl_data._M_start;
  if ((values->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>)._M_impl.
      super__Vector_impl_data._M_finish != local_378) {
    uVar7 = 0;
    local_37c = arrayNdx;
    local_368 = storageName;
    local_340 = values;
    local_338 = log;
    do {
      pcVar8 = local_378[uVar7].name._M_dataplus._M_p;
      DVar6 = local_378[uVar7].type.m_data.basic.type;
      local_398 = (ulong)DVar6;
      local_330 = uVar7;
      iVar2 = getDataTypeScalarSize(DVar6);
      local_388 = CONCAT44(extraout_var,iVar2);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"    ",4);
      if (storageName == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x80);
      }
      else {
        sVar5 = strlen(storageName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,storageName,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      __s = getDataTypeName((DataType)local_398);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x80);
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_328[0] + -0x18) + 0x80);
      }
      else {
        sVar5 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,":",1);
      uVar10 = local_398;
      lVar11 = 3;
      if ((uint)local_398 < 0x24) {
        if ((0x77003801cU >> (local_398 & 0x3f) & 1) == 0) {
          if ((0x888004002U >> (local_398 & 0x3f) & 1) == 0) goto LAB_00a37ed7;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ",1);
          if (((uint)local_398 < 0x23) &&
             (pcVar8 = " [ ", (0x77003801cU >> (uVar10 & 0x3f) & 1) != 0)) goto LAB_00a37b6c;
          goto LAB_00a37eea;
        }
        pcVar8 = " [ ";
LAB_00a37b6c:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,lVar11);
      }
      else {
LAB_00a37ed7:
        pcVar8 = " [ ";
        if ((uint)local_398 - 0x24 < 3) goto LAB_00a37b6c;
LAB_00a37eea:
        lVar11 = 1;
        pcVar8 = "\n";
        if ((int)local_398 - 5U < 9 || (int)local_398 - 0x12U < 9) goto LAB_00a37b6c;
      }
      local_378 = local_378 + uVar7;
      DVar6 = (DataType)local_398;
      if (((DVar6 < TYPE_BOOL) && ((0x7f803c01eU >> (uVar10 & 0x3f) & 1) != 0)) ||
         (DVar6 - TYPE_BOOL < 4)) {
        if (0 < (int)local_388) {
          local_38c = (float)(DVar6 - TYPE_INT);
          local_39c = DVar6 - TYPE_UINT;
          local_36c = DVar6 - TYPE_BOOL;
          uVar7 = local_388 & 0xffffffff;
          iVar2 = (int)local_388 * local_37c;
          uVar10 = 0;
          do {
            pEVar1 = (local_378->elements).
                     super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar8 = ", ";
            if (uVar10 == 0) {
              pcVar8 = "";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_328,pcVar8,(ulong)((uint)(uVar10 != 0) * 2));
            iVar3 = iVar2 + (int)uVar10;
            if (DVar6 - TYPE_FLOAT < 4) {
              std::ostream::_M_insert<double>((double)pEVar1[iVar3].float32);
            }
            else if ((uint)local_38c < 4) {
              std::ostream::operator<<((ostringstream *)local_328,pEVar1[iVar3].int32);
            }
            else if (local_39c < 4) {
              std::ostream::_M_insert<unsigned_long>((ulong)local_328);
            }
            else if (local_36c < 4) {
              pcVar8 = "true";
              if (pEVar1[iVar3].int32 == 0) {
                pcVar8 = "false";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_328,pcVar8,(ulong)(pEVar1[iVar3].int32 == 0) | 4);
            }
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
      }
      else if (DVar6 - TYPE_FLOAT_MAT2 < 9 || DVar6 - TYPE_DOUBLE_MAT2 < 9) {
        local_39c = getDataTypeMatrixNumRows(DVar6);
        uVar4 = getDataTypeMatrixNumColumns(DVar6);
        if (0 < (int)local_39c) {
          local_388 = (ulong)(uint)((int)local_388 * local_37c);
          uVar9 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"       [ ",9);
            if (0 < (int)uVar4) {
              uVar7 = 0;
              do {
                local_38c = (local_378->elements).
                            super__Vector_base<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)local_388 + (int)uVar7].
                            float32;
                pcVar8 = ", ";
                if (uVar7 == 0) {
                  pcVar8 = "";
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_328,pcVar8,(ulong)((uint)(uVar7 != 0) * 2));
                std::ostream::_M_insert<double>((double)local_38c);
                uVar7 = uVar7 + 1;
              } while (uVar4 != uVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," ]\n",3);
            uVar9 = uVar9 + 1;
            local_388 = local_388 + uVar4;
          } while (uVar9 != local_39c);
        }
      }
      storageName = local_368;
      uVar4 = (int)local_398 - 1;
      if ((uVar4 < 0x23) && ((0x7fc01e00fU >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        pcVar8 = &DAT_00b8bb90 + *(int *)(&DAT_00b8bb90 + (ulong)uVar4 * 4);
        lVar11 = *(long *)(&DAT_00b8bc20 + (ulong)uVar4 * 8);
LAB_00a37cef:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,pcVar8,lVar11);
      }
      else {
        lVar11 = 3;
        pcVar8 = " ]\n";
        if ((int)local_398 - 0x24U < 3) goto LAB_00a37cef;
      }
      this = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = local_338;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(char *)local_360,local_358);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_360 != local_350) {
        operator_delete(local_360,local_350[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      uVar7 = local_330 + 1;
      local_378 = (local_340->super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(local_340->
                                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)local_378 >>
                             4) * -0x3333333333333333));
  }
  return;
}

Assistant:

static void dumpValues (tcu::TestLog& log, const vector<Value>& values, const char* storageName, int arrayNdx)
{
	for (size_t valNdx = 0; valNdx < values.size(); valNdx++)
		dumpValue(log, values[valNdx], storageName, arrayNdx);
}